

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O0

Vector3d *
sdf::SDFGradientPosNorm
          (Vector3d *location,
          vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives)

{
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RSI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  Vector3d v;
  double delta;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *other_00;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffffd50;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *this;
  Scalar *in_stack_fffffffffffffd68;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *z;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd70;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd78;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *this_00;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffffd80;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_01;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *in_stack_fffffffffffffe28;
  Vector3d *in_stack_fffffffffffffe30;
  
  other_00 = in_RSI;
  this_01 = in_RDI;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffd80,(Scalar *)in_stack_fffffffffffffd78,
             (Scalar *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (in_stack_fffffffffffffd50,other_00);
  SDF(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  this = in_RSI;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffd80,(Scalar *)in_stack_fffffffffffffd78,
             (Scalar *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)other_00);
  SDF(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffd80,(Scalar *)in_stack_fffffffffffffd78,
             (Scalar *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,other_00);
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
          SDF(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  z = in_RSI;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffd80,(Scalar *)in_stack_fffffffffffffd78,(Scalar *)other,
             (Scalar *)in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(in_stack_fffffffffffffd78,other);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)other_00);
  SDF(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  this_00 = in_RSI;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffd80,(Scalar *)in_RSI,(Scalar *)other,(Scalar *)z);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00,other);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,other_00);
  SDF(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,(Scalar *)this_00,(Scalar *)other,(Scalar *)z);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00,other);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)other_00);
  SDF(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,(Scalar *)this_00,(Scalar *)other,(Scalar *)z);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized(this_01);
  return (Vector3d *)in_RDI;
}

Assistant:

Eigen::Vector3d 
  SDFGradientPosNorm(const Eigen::Vector3d &location,  std::vector<Primitive*> &primitives)
  {
    double delta=1e-05;
    Eigen::Vector3d v = Eigen::Vector3d(
           fabs(SDF(location + Eigen::Vector3d(delta,0,0), primitives) - SDF(location - Eigen::Vector3d(delta,0,0), primitives)),
           fabs(SDF(location + Eigen::Vector3d(0,delta,0), primitives) - SDF(location - Eigen::Vector3d(0,delta,0), primitives)),
           fabs(SDF(location + Eigen::Vector3d(0,0,delta), primitives) - SDF(location - Eigen::Vector3d(0,0,delta), primitives))/(2.0*delta));
    return v.normalized();
  }